

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_writers.h
# Opt level: O0

void cppwinrt::write_module_g_cpp
               (writer *w,
               vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *classes)

{
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *pvVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  anon_class_8_1_898e5d9c_conflict1 local_50;
  anon_class_8_1_898e5d9c_conflict1 local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  char *local_30;
  char *format;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *local_18;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *classes_local;
  writer *w_local;
  
  local_18 = classes;
  classes_local = (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)w;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&format,"base");
  writer::write_root_include(w,(string_view *)&format);
  pvVar1 = classes_local;
  local_30 = 
  "%\nbool __stdcall %_can_unload_now() noexcept\n{\n    if (winrt::get_module_lock())\n    {\n        return false;\n    }\n\n    winrt::clear_factory_cache();\n    return true;\n}\n\nvoid* __stdcall %_get_activation_factory([[maybe_unused]] std::wstring_view const& name)\n{\n    auto requal = [](std::wstring_view const& left, std::wstring_view const& right) noexcept\n    {\n        return std::equal(left.rbegin(), left.rend(), right.rbegin(), right.rend());\n    };\n%\n    return nullptr;\n}\n"
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,
             "%\nbool __stdcall %_can_unload_now() noexcept\n{\n    if (winrt::get_module_lock())\n    {\n        return false;\n    }\n\n    winrt::clear_factory_cache();\n    return true;\n}\n\nvoid* __stdcall %_get_activation_factory([[maybe_unused]] std::wstring_view const& name)\n{\n    auto requal = [](std::wstring_view const& left, std::wstring_view const& right) noexcept\n    {\n        return std::equal(left.rbegin(), left.rend(), right.rbegin(), right.rend());\n    };\n%\n    return nullptr;\n}\n"
            );
  local_48 = bind_each<&cppwinrt::write_component_include,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                       (local_18);
  local_50 = bind_each<&cppwinrt::write_component_activation,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                       (local_18);
  writer_base<cppwinrt::writer>::
  write<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:446:16),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:446:16)>
            ((writer_base<cppwinrt::writer> *)pvVar1,&local_40,&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(settings + 0x118)
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (settings + 0x118),&local_50);
  bVar2 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (settings + 0x118),"winrt");
  pvVar1 = classes_local;
  if (!bVar2) {
    local_30 = 
    "\nint32_t __stdcall WINRT_CanUnloadNow() noexcept\n{\n#ifdef _WRL_MODULE_H_\n    if (!::Microsoft::WRL::Module<::Microsoft::WRL::InProc>::GetModule().Terminate())\n    {\n        return 1;\n    }\n#endif\n\n    return %_can_unload_now() ? 0 : 1;\n}\n\nint32_t __stdcall WINRT_GetActivationFactory(void* classId, void** factory) noexcept try\n{\n    std::wstring_view const name{ *reinterpret_cast<winrt::hstring*>(&classId) };\n    *factory = %_get_activation_factory(name);\n\n    if (*factory)\n    {\n        return 0;\n    }\n\n#ifdef _WRL_MODULE_H_\n    return ::Microsoft::WRL::Module<::Microsoft::WRL::InProc>::GetModule().GetActivationFactory(static_cast<HSTRING>(classId), reinterpret_cast<::IActivationFactory**>(factory));\n#else\n    return winrt::hresult_class_not_available(name).to_abi();\n#endif\n}\ncatch (...) { return winrt::to_hresult(); }\n"
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,
               "\nint32_t __stdcall WINRT_CanUnloadNow() noexcept\n{\n#ifdef _WRL_MODULE_H_\n    if (!::Microsoft::WRL::Module<::Microsoft::WRL::InProc>::GetModule().Terminate())\n    {\n        return 1;\n    }\n#endif\n\n    return %_can_unload_now() ? 0 : 1;\n}\n\nint32_t __stdcall WINRT_GetActivationFactory(void* classId, void** factory) noexcept try\n{\n    std::wstring_view const name{ *reinterpret_cast<winrt::hstring*>(&classId) };\n    *factory = %_get_activation_factory(name);\n\n    if (*factory)\n    {\n        return 0;\n    }\n\n#ifdef _WRL_MODULE_H_\n    return ::Microsoft::WRL::Module<::Microsoft::WRL::InProc>::GetModule().GetActivationFactory(static_cast<HSTRING>(classId), reinterpret_cast<::IActivationFactory**>(factory));\n#else\n    return winrt::hresult_class_not_available(name).to_abi();\n#endif\n}\ncatch (...) { return winrt::to_hresult(); }\n"
              );
    writer_base<cppwinrt::writer>::write<std::__cxx11::string,std::__cxx11::string>
              ((writer_base<cppwinrt::writer> *)pvVar1,&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (settings + 0x118),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (settings + 0x118));
  }
  return;
}

Assistant:

static void write_module_g_cpp(writer& w, std::vector<TypeDef> const& classes)
    {
        w.write_root_include("base");
        auto format = R"(%
bool __stdcall %_can_unload_now() noexcept
{
    if (winrt::get_module_lock())
    {
        return false;
    }

    winrt::clear_factory_cache();
    return true;
}

void* __stdcall %_get_activation_factory([[maybe_unused]] std::wstring_view const& name)
{
    auto requal = [](std::wstring_view const& left, std::wstring_view const& right) noexcept
    {
        return std::equal(left.rbegin(), left.rend(), right.rbegin(), right.rend());
    };
%
    return nullptr;
}
)";

        w.write(format,
            bind_each<write_component_include>(classes),
            settings.component_lib,
            settings.component_lib,
            bind_each<write_component_activation>(classes));

        if (settings.component_lib != "winrt")
        {
            return;
        }

        format = R"(
int32_t __stdcall WINRT_CanUnloadNow() noexcept
{
#ifdef _WRL_MODULE_H_
    if (!::Microsoft::WRL::Module<::Microsoft::WRL::InProc>::GetModule().Terminate())
    {
        return 1;
    }
#endif

    return %_can_unload_now() ? 0 : 1;
}

int32_t __stdcall WINRT_GetActivationFactory(void* classId, void** factory) noexcept try
{
    std::wstring_view const name{ *reinterpret_cast<winrt::hstring*>(&classId) };
    *factory = %_get_activation_factory(name);

    if (*factory)
    {
        return 0;
    }

#ifdef _WRL_MODULE_H_
    return ::Microsoft::WRL::Module<::Microsoft::WRL::InProc>::GetModule().GetActivationFactory(static_cast<HSTRING>(classId), reinterpret_cast<::IActivationFactory**>(factory));
#else
    return winrt::hresult_class_not_available(name).to_abi();
#endif
}
catch (...) { return winrt::to_hresult(); }
)";

        w.write(format,
            settings.component_lib,
            settings.component_lib);
    }